

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O0

void __thiscall
jsonip::detail::struct_helper<C>::member_writer<jsonip::writer<false>>::operator()
          (member_writer<jsonip::writer<false>> *this,integral_c<int,_0> *param_1)

{
  writer<false> *pwVar1;
  type str;
  type t;
  integral_c<int,_0> *param_1_local;
  member_writer<jsonip::writer<false>_> *this_local;
  
  pwVar1 = *(writer<false> **)this;
  str = boost::fusion::extension::struct_member_name<C,_0>::call();
  writer<false>::new_member(pwVar1,str);
  pwVar1 = *(writer<false> **)this;
  t = boost::fusion::at<mpl_::integral_c<int,0>,C>(*(C **)(this + 8));
  struct_helper<A>::write<jsonip::writer<false>>(pwVar1,t);
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }